

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void minimalSwapAndFlipIVar_superFast_iVar5
               (uint *pInOut,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  uint jQ;
  uint uVar2;
  uint lQ;
  uint iQ;
  uint kQ;
  int M [2];
  int DifStart1;
  int DifStart0;
  int DifStartMin;
  uint temp [2048];
  
  uVar1 = minTemp0_fast_iVar5(pInOut,nWords,&DifStart0);
  M[0] = uVar1;
  jQ = minTemp1_fast_iVar5(pInOut,nWords,&DifStart1);
  M[1] = jQ;
  uVar2 = minTemp2_fast_iVar5(pInOut,uVar1,jQ,nWords,&DifStartMin);
  if (DifStart0 == DifStart1) {
    if (DifStartMin < DifStart0) {
      uVar1 = minTemp3_fast_iVar5(pInOut,DifStart0,DifStartMin,uVar1 ^ 3,jQ ^ 3,&DifStart1);
      if (DifStartMin < DifStart1) {
        iQ = M[uVar1 ^ 1];
        uVar1 = M[uVar1];
      }
      else {
        iQ = M[uVar2];
        uVar1 = M[uVar2 ^ 1];
      }
      kQ = 3 - uVar1;
      lQ = 3 - iQ;
      goto LAB_004d14c3;
    }
  }
  else if (DifStartMin < DifStart0 || DifStartMin < DifStart1) {
    if (DifStart1 < DifStart0) {
      if (DifStart0 < DifStartMin) {
        DifStart0 = DifStartMin;
      }
      kQ = jQ ^ 3;
      lQ = uVar1 ^ 3;
      iQ = uVar1;
      uVar1 = jQ;
    }
    else {
      if (DifStart1 < DifStartMin) {
        DifStart1 = DifStartMin;
      }
      kQ = uVar1 ^ 3;
      lQ = jQ ^ 3;
      iQ = jQ;
      DifStart0 = DifStart1;
    }
    goto LAB_004d14c3;
  }
  kQ = 3 - M[uVar2 ^ 1];
  lQ = 3 - M[uVar2];
  iQ = M[uVar2];
  uVar1 = M[uVar2 ^ 1];
  DifStart0 = DifStartMin;
LAB_004d14c3:
  arrangeQuoters_superFast_iVar5(pInOut,temp,DifStart0,iQ,uVar1,kQ,lQ,pCanonPerm,pCanonPhase);
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_iVar5(unsigned* pInOut, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin;
    int M[2];
    unsigned temp[2048];
//     printf("in minimalSwapAndFlipIVar_superFast_iVar5\n");
    M[0] = minTemp0_fast_iVar5(pInOut, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast_iVar5(pInOut, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast_iVar5(pInOut, M[0], M[1], nWords, &DifStartMin);
    if(DifStart0 != DifStart1)
    {   
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_iVar5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_iVar5(pInOut, temp, luckyMax(DifStartMin,DifStart0), M[0], M[1], 3 - M[1], 3 - M[0], pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_iVar5(pInOut, temp, luckyMax(DifStartMin,DifStart1), M[1], M[0], 3 - M[0], 3 - M[1], pCanonPerm, pCanonPhase);
    }
    else
    {
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_iVar5(pInOut, temp, DifStartMin, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast_iVar5(pInOut, DifStart0, DifStartMin, 3-M[0], 3-M[1], &DifStart1);  // reuse DifStart1 because DifStart1 = DifStart1=0
            if(DifStart1>DifStartMin)
                arrangeQuoters_superFast_iVar5(pInOut, temp, DifStart0, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_iVar5(pInOut, temp, DifStart0, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], pCanonPerm, pCanonPhase);
        }
    }
}